

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::ApproxQuantileDecimalFunction(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  InternalException *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  switch(type[1]) {
  case (LogicalType)0x3:
    duckdb::LogicalType::LogicalType((LogicalType *)local_40,TINYINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)local_40);
    break;
  case (LogicalType)0x4:
  case (LogicalType)0x6:
  case (LogicalType)0x8:
switchD_004bfb35_caseD_4:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Unimplemented quantile decimal aggregate","");
    duckdb::InternalException::InternalException(this,(string *)local_40);
    __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case (LogicalType)0x5:
    duckdb::LogicalType::LogicalType((LogicalType *)local_40,SMALLINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)local_40);
    break;
  case (LogicalType)0x7:
    duckdb::LogicalType::LogicalType((LogicalType *)local_40,INTEGER);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)local_40);
    break;
  case (LogicalType)0x9:
    duckdb::LogicalType::LogicalType((LogicalType *)local_40,BIGINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)local_40);
    break;
  default:
    if (type[1] != (LogicalType)0xcc) goto switchD_004bfb35_caseD_4;
    duckdb::LogicalType::LogicalType((LogicalType *)local_40,HUGEINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)local_40);
  }
  duckdb::LogicalType::~LogicalType((LogicalType *)local_40);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->field_0x8,0,
             *(char **)&__return_storage_ptr__->field_0x10,0x76c70b);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction ApproxQuantileDecimalFunction(const LogicalType &type) {
	auto function = GetApproximateQuantileDecimalAggregateFunction(type);
	function.name = "approx_quantile";
	function.serialize = ApproximateQuantileBindData::Serialize;
	function.deserialize = ApproximateQuantileBindData::Deserialize;
	return function;
}